

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

json_type __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::type
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  json_storage_kind jVar1;
  json_type jVar2;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  
  jVar1 = storage_kind(in_RDI);
  jVar2 = (*(code *)(&DAT_00f07e28 + *(int *)(&DAT_00f07e28 + (ulong)jVar1 * 4)))();
  return jVar2;
}

Assistant:

json_type type() const
        {
            switch(storage_kind())
            {
                case json_storage_kind::null:
                    return json_type::null_value;
                case json_storage_kind::boolean:
                    return json_type::bool_value;
                case json_storage_kind::int64:
                    return json_type::int64_value;
                case json_storage_kind::uint64:
                    return json_type::uint64_value;
                case json_storage_kind::half_float:
                    return json_type::half_value;
                case json_storage_kind::float64:
                    return json_type::double_value;
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                    return json_type::string_value;
                case json_storage_kind::byte_str:
                    return json_type::byte_string_value;
                case json_storage_kind::array:
                    return json_type::array_value;
                case json_storage_kind::empty_object:
                case json_storage_kind::object:
                    return json_type::object_value;
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().type();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().type();
                default:
                    JSONCONS_UNREACHABLE();
                    break;
            }
        }